

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O2

void __thiscall
uWS::Group<true>::Group(Group<true> *this,int extensionOptions,Hub *hub,NodeData *nodeData)

{
  _Requires<_Callable<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_k0ff33[P]uWebSockets_src_Group_cpp:80:33)>,_function<void_(WebSocket<true>,_char_*,_unsigned_long)>_&>
  __x;
  anon_class_1_0_00000001 local_55;
  anon_class_1_0_00000001 local_54;
  anon_class_1_0_00000001 local_53;
  anon_class_1_0_00000001 local_52;
  anon_class_1_0_00000001 local_51 [9];
  function<void(uWS::WebSocket<true>,char*,unsigned_long,uWS::OpCode)> *local_48;
  function<void(int)> *local_40;
  function<void(uWS::WebSocket<true>,char*,unsigned_long)> *local_38;
  
  uS::NodeData::NodeData(&this->super_NodeData,nodeData);
  local_48 = (function<void(uWS::WebSocket<true>,char*,unsigned_long,uWS::OpCode)> *)
             &this->messageHandler;
  local_38 = (function<void(uWS::WebSocket<true>,char*,unsigned_long)> *)&this->pongHandler;
  local_40 = (function<void(int)> *)&this->errorHandler;
  memset(&this->connectionHandler,0,0xc0);
  this->hub = hub;
  this->extensionOptions = extensionOptions;
  this->timer = (uv_timer_t *)0x0;
  (this->userPingMessage)._M_dataplus._M_p = (pointer)&(this->userPingMessage).field_2;
  (this->userPingMessage)._M_string_length = 0;
  (this->userPingMessage).field_2._M_local_buf[0] = '\0';
  this->userData = (void *)0x0;
  this->webSocketHead = (uv_poll_t *)0x0;
  this->httpSocketHead = (uv_poll_t *)0x0;
  std::stack<uv_poll_s*,std::deque<uv_poll_s*,std::allocator<uv_poll_s*>>>::
  stack<std::deque<uv_poll_s*,std::allocator<uv_poll_s*>>,void>(&this->iterators);
  std::function<void(uWS::WebSocket<true>,uWS::UpgradeInfo)>::operator=
            ((function<void(uWS::WebSocket<true>,uWS::UpgradeInfo)> *)&this->connectionHandler,
             local_51);
  std::function<void(uWS::WebSocket<true>,char*,unsigned_long,uWS::OpCode)>::operator=
            (local_48,&local_52);
  std::function<void(uWS::WebSocket<true>,int,char*,unsigned_long)>::operator=
            ((function<void(uWS::WebSocket<true>,int,char*,unsigned_long)> *)
             &this->disconnectionHandler,&local_53);
  __x = std::function<void(uWS::WebSocket<true>,char*,unsigned_long)>::operator=(local_38,&local_54)
  ;
  std::function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long)>::operator=
            (&this->pingHandler,__x);
  std::function<void(int)>::operator=(local_40,&local_55);
  *(byte *)&this->extensionOptions = (byte)this->extensionOptions | 6;
  return;
}

Assistant:

Group<isServer>::Group(int extensionOptions, Hub *hub, uS::NodeData *nodeData) : uS::NodeData(*nodeData), hub(hub), extensionOptions(extensionOptions) {
    connectionHandler = [](WebSocket<isServer>, UpgradeInfo) {};
    messageHandler = [](WebSocket<isServer>, char *, size_t, OpCode) {};
    disconnectionHandler = [](WebSocket<isServer>, int, char *, size_t) {};
    pingHandler = pongHandler = [](WebSocket<isServer>, char *, size_t) {};
    errorHandler = [](errorType) {};

    this->extensionOptions |= CLIENT_NO_CONTEXT_TAKEOVER | SERVER_NO_CONTEXT_TAKEOVER;
}